

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

undefined4 __thiscall despot::TagBlindBeliefPolicy::Value(TagBlindBeliefPolicy *this,Belief *belief)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined4 local_30 [4];
  
  dVar4 = Globals::NEG_INFTY;
  iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
  iVar3 = -1;
  if (0 < iVar1) {
    iVar1 = 0;
    dVar5 = dVar4;
    do {
      dVar4 = (double)despot::MDP::ComputeActionValue
                                ((ParticleBelief *)this->tag_model_,(StateIndexer *)belief,
                                 (int)this->tag_model_ + 0x40);
      iVar2 = iVar1;
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
        iVar2 = iVar3;
      }
      iVar3 = iVar2;
      iVar1 = iVar1 + 1;
      iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
      dVar5 = dVar4;
    } while (iVar1 < iVar2);
  }
  despot::ValuedAction::ValuedAction((ValuedAction *)local_30,iVar3,dVar4);
  return local_30[0];
}

Assistant:

ValuedAction Value(const Belief* belief) const {
		double bestValue = Globals::NEG_INFTY;
		int bestAction = -1;
		for (ACT_TYPE action = 0; action < tag_model_->NumActions(); action++) {
			double value = tag_model_->ComputeActionValue(
				static_cast<const ParticleBelief*>(belief), *tag_model_,
				action);
			if (value > bestValue) {
				bestValue = value;
				bestAction = action;
			}
		}

		return ValuedAction(bestAction, bestValue);
	}